

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall TextEntry::TextEntry(TextEntry *this,char *initial_text)

{
  ALLEGRO_USTR *pAVar1;
  
  *(undefined8 *)((long)&(this->super_Widget).x1 + 1) = 0;
  *(undefined8 *)((long)&(this->super_Widget).x2 + 1) = 0;
  (this->super_Widget).dialog = (Dialog *)0x0;
  (this->super_Widget).x1 = 0;
  (this->super_Widget).y1 = 0;
  (this->super_Widget).grid_x = 0;
  (this->super_Widget).grid_y = 0;
  (this->super_Widget).grid_w = 0;
  (this->super_Widget).grid_h = 0;
  (this->super_Widget)._vptr_Widget = (_func_int **)&PTR__TextEntry_0010caf0;
  this->focused = false;
  this->cursor_pos = 0;
  this->left_pos = 0;
  pAVar1 = (ALLEGRO_USTR *)al_ustr_new(initial_text);
  this->text = pAVar1;
  return;
}

Assistant:

TextEntry::TextEntry(const char *initial_text) :
   focused(false),
   cursor_pos(0),
   left_pos(0)
{
   text = al_ustr_new(initial_text);
}